

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>::
DeviceObjectBase(DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                 *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                TopLevelASDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  Uint64 UVar2;
  Uint64 UVar3;
  Uint32 UVar4;
  RAYTRACING_BUILD_AS_FLAGS RVar5;
  undefined3 uVar6;
  int iVar7;
  size_t sVar8;
  IMemoryAllocator *pIVar9;
  char *pcVar10;
  undefined4 extraout_var_00;
  TopLevelASDesc *Args_1;
  RenderDeviceVkImpl *this_00;
  string msg;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  ObjectBase<Diligent::ITopLevelASVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::ITopLevelASVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::ITopLevelASVk>).super_RefCountedObject<Diligent::ITopLevelASVk>.
  super_ITopLevelASVk.super_ITopLevelAS.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00a52e38;
  this->m_pDevice = pDevice;
  UVar4 = ObjDesc->MaxInstanceCount;
  RVar5 = ObjDesc->Flags;
  uVar6 = *(undefined3 *)&ObjDesc->field_0xd;
  UVar2 = ObjDesc->CompactedSize;
  UVar3 = ObjDesc->ImmediateContextMask;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).MaxInstanceCount = UVar4;
  (this->m_Desc).Flags = RVar5;
  *(undefined3 *)&(this->m_Desc).field_0xd = uVar6;
  (this->m_Desc).CompactedSize = UVar2;
  (this->m_Desc).ImmediateContextMask = UVar3;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar7 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar7 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar7 = iVar7 + 1;
  }
  this->m_UniqueID = iVar7;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    this_00 = this->m_pDevice;
    if (this_00 == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pDevice != nullptr"
                 ,(char (*) [21])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      std::__cxx11::string::~string((string *)&msg);
      this_00 = this->m_pDevice;
    }
    RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceVk> *)this_00);
  }
  pcVar10 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar10 == (char *)0x0) {
    pIVar9 = GetStringAllocator();
    iVar7 = (**pIVar9->_vptr_IMemoryAllocator)
                      (pIVar9,0x13,"Object address string",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x55);
    pcVar10 = (char *)CONCAT44(extraout_var_00,iVar7);
    snprintf(pcVar10,0x13,"0x%llX",this);
  }
  else {
    sVar8 = strlen(pcVar10);
    pIVar9 = GetStringAllocator();
    iVar7 = (**pIVar9->_vptr_IMemoryAllocator)
                      (pIVar9,sVar8 + 1,"Object name copy",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x4e);
    pcVar10 = (char *)CONCAT44(extraout_var,iVar7);
    memcpy(pcVar10,(ObjDesc->super_DeviceObjectAttribs).Name,sVar8 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar10;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }